

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O0

void Ssw_ManSweepTransfer(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *p_01;
  Aig_Obj_t *pAVar2;
  uint *puVar3;
  int local_2c;
  int i;
  uint *pInfo;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(p->pAig->vCis);
    if (iVar1 <= local_2c) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_2c);
    p_01 = Ssw_ObjFrame(p,pObj_00,0);
    pAVar2 = Aig_ManConst0(p->pFrames);
    if (p_01 == pAVar2) {
      Ssw_SmlObjAssignConst(p->pSml,pObj_00,0,0);
    }
    else {
      iVar1 = Aig_IsComplement(p_01);
      if (iVar1 != 0) {
        __assert_fail("!Aig_IsComplement(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                      ,0x3c,"void Ssw_ManSweepTransfer(Ssw_Man_t *)");
      }
      iVar1 = Aig_ObjIsCi(p_01);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsCi(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                      ,0x3d,"void Ssw_ManSweepTransfer(Ssw_Man_t *)");
      }
      p_00 = p->vSimInfo;
      iVar1 = Aig_ObjCioId(p_01);
      puVar3 = (uint *)Vec_PtrEntry(p_00,iVar1);
      Ssw_SmlObjSetWord(p->pSml,pObj_00,*puVar3,0,0);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Tranfers simulation information from FRAIG to AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManSweepTransfer( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFraig;
    unsigned * pInfo;
    int i;
    // transfer simulation information
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pObjFraig = Ssw_ObjFrame( p, pObj, 0 );
        if ( pObjFraig == Aig_ManConst0(p->pFrames) )
        {
            Ssw_SmlObjAssignConst( p->pSml, pObj, 0, 0 );
            continue;
        }
        assert( !Aig_IsComplement(pObjFraig) );
        assert( Aig_ObjIsCi(pObjFraig) );
        pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
        Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, 0 );
    }
}